

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update2_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  C_Integer *pCVar8;
  char *pcVar9;
  bool bVar10;
  global_array_t *pgVar11;
  int iVar12;
  Integer proc;
  logical lVar13;
  Integer *map;
  ulong *proclist;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  C_Integer CVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong proc_00;
  int _ndim_4;
  ulong uVar31;
  int _ndim;
  int local_588;
  int _index [7];
  Integer _hi [7];
  Integer np;
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  char err_string [256];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  if (lVar13 != 0) {
    lVar13 = gai_check_ghost_distr(g_a);
    IVar16 = GAnproc;
    if (lVar13 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
      IVar16 = GAnproc;
    }
    lVar1 = g_a + 1000;
    proclist = (ulong *)malloc(IVar16 << 3);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
    }
    pgVar11 = GA;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    lVar24 = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    if (lVar24 < 1) {
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      lVar28 = 1;
    }
    else {
      memcpy(width,GA[g_a + 1000].width,lVar24 * 8);
      memcpy(dims,pgVar11[g_a + 1000].dims,lVar24 * 8);
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      lVar28 = 1;
      lVar14 = lVar24;
      do {
        lVar28 = lVar28 * 3;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    lVar14 = 0;
    do {
      if (0 < sVar2) {
        bVar10 = true;
        lVar27 = 0;
        lVar19 = lVar14;
        do {
          lVar21 = ~((lVar19 / 3) * 3) + lVar19;
          if (lVar21 != 0) {
            bVar10 = false;
          }
          mask[lVar27] = lVar21;
          lVar27 = lVar27 + 1;
          lVar19 = lVar19 / 3;
        } while (lVar24 != lVar27);
        if (!bVar10) {
          if (0 < sVar2) {
            lVar19 = 0;
            bVar10 = false;
            do {
              if ((mask[lVar19] != 0) && (width[lVar19] == 0)) {
                bVar10 = true;
              }
              lVar19 = lVar19 + 1;
            } while (lVar24 != lVar19);
            if (bVar10) goto LAB_0017bc3c;
            if (0 < sVar2) {
              lVar19 = 0;
              do {
                lVar27 = mask[lVar19];
                if (lVar27 == -1) {
                  lVar27 = lo_loc[lVar19];
                  if (1 < lVar27) {
                    tlo_rem[lVar19] = lVar27 - width[lVar19];
                    lVar27 = lVar27 + -1;
                    goto LAB_0017af8f;
                  }
                  thi_rem[lVar19] = dims[lVar19];
                  tlo_rem[lVar19] = (dims[lVar19] - width[lVar19]) + 1;
                }
                else {
                  if (lVar27 == 1) {
                    lVar27 = hi_loc[lVar19];
                    if (lVar27 < dims[lVar19]) {
                      tlo_rem[lVar19] = lVar27 + 1;
                      lVar27 = lVar27 + width[lVar19];
                    }
                    else {
                      tlo_rem[lVar19] = 1;
                      lVar27 = width[lVar19];
                    }
                  }
                  else {
                    if (lVar27 != 0) {
                      pnga_update2_ghosts_cold_1();
                      goto LAB_0017af97;
                    }
                    tlo_rem[lVar19] = lo_loc[lVar19];
                    lVar27 = hi_loc[lVar19];
                  }
LAB_0017af8f:
                  thi_rem[lVar19] = lVar27;
                }
LAB_0017af97:
                lVar19 = lVar19 + 1;
              } while (lVar24 != lVar19);
            }
          }
          lVar13 = pnga_locate_region(g_a,tlo_rem,thi_rem,map,(Integer *)proclist,&np);
          if (lVar13 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar15 = strlen(err_string);
            sprintf(err_string + (int)sVar15," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
            sVar15 = strlen(err_string);
            iVar18 = (int)sVar15;
            IVar16 = pnga_ndim(g_a);
            if (1 < IVar16) {
              lVar19 = 1;
              do {
                sprintf(err_string + (int)sVar15,",%ld:%ld ",tlo_rem[lVar19],thi_rem[lVar19]);
                sVar15 = strlen(err_string);
                iVar18 = (int)sVar15;
                lVar19 = lVar19 + 1;
                IVar16 = pnga_ndim(g_a);
              } while (lVar19 < IVar16);
            }
            (err_string + iVar18)[0] = ']';
            (err_string + iVar18)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          if (1 < np) {
            pnga_update2_ghosts_cold_2();
          }
          proc_00 = *proclist;
          pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
          pgVar11 = GA;
          if (0 < sVar2) {
            lVar19 = 0;
            do {
              lVar27 = mask[lVar19];
              if (lVar27 == -1) {
                lVar27 = width[lVar19];
                plo_loc[lVar19] = lVar27;
                phi_loc[lVar19] = lVar27 * 2 + -1;
                lVar27 = ((lVar27 + thi_rem[lVar19]) - tlo_rem[lVar19]) + 1;
LAB_0017b21a:
                plo_rem[lVar19] = lVar27;
              }
              else {
                if (lVar27 == 1) {
                  plo_loc[lVar19] = (hi_loc[lVar19] - lo_loc[lVar19]) + 1;
                  phi_loc[lVar19] = (hi_loc[lVar19] - lo_loc[lVar19]) + width[lVar19];
                  lVar27 = 0;
                  goto LAB_0017b21a;
                }
                if (lVar27 == 0) {
                  lVar27 = width[lVar19];
                  plo_loc[lVar19] = lVar27;
                  phi_loc[lVar19] = (hi_loc[lVar19] + lVar27) - lo_loc[lVar19];
                  goto LAB_0017b21a;
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar24 != lVar19);
          }
          uVar3 = GA[lVar1].ndim;
          uVar31 = (ulong)(short)uVar3;
          iVar18 = GA[lVar1].distr_type;
          if (iVar18 - 1U < 3) {
            lVar19 = GA[lVar1].num_blocks[0];
            lVar27 = (long)(int)proc % lVar19;
            _index[0] = (int)lVar27;
            if (1 < (short)uVar3) {
              lVar21 = 0;
              IVar16 = proc;
              do {
                IVar16 = (long)((int)IVar16 - (int)lVar27) / lVar19;
                lVar19 = GA[g_a + 1000].num_blocks[lVar21 + 1];
                lVar27 = (long)(int)IVar16 % lVar19;
                _index[lVar21 + 1] = (int)lVar27;
                lVar21 = lVar21 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar21);
            }
            if (0 < (short)uVar3) {
              lVar19 = 0;
              do {
                iVar20 = *(int *)((long)_index + lVar19);
                lVar27 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
                *(long *)(err_string + lVar19 * 2) = lVar27 * iVar20 + 1;
                lVar27 = ((long)iVar20 + 1) * lVar27;
                lVar21 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
                if (lVar21 <= lVar27) {
                  lVar27 = lVar21;
                }
                *(long *)((long)_hi + lVar19 * 2) = lVar27;
                lVar19 = lVar19 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar19);
            }
          }
          else if (iVar18 == 4) {
            lVar19 = GA[lVar1].num_blocks[0];
            lVar27 = (long)(int)proc % lVar19;
            _index[0] = (int)lVar27;
            if (1 < (short)uVar3) {
              lVar21 = 0;
              IVar16 = proc;
              do {
                IVar16 = (long)((int)IVar16 - (int)lVar27) / lVar19;
                lVar19 = GA[g_a + 1000].num_blocks[lVar21 + 1];
                lVar27 = (long)(int)IVar16 % lVar19;
                _index[lVar21 + 1] = (int)lVar27;
                lVar21 = lVar21 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar21);
            }
            if (0 < (short)uVar3) {
              pCVar8 = GA[lVar1].mapc;
              lVar19 = 0;
              iVar20 = 0;
              do {
                iVar12 = *(int *)((long)_index + lVar19);
                lVar21 = (long)iVar20 + (long)iVar12;
                *(C_Integer *)(err_string + lVar19 * 2) = pCVar8[lVar21];
                lVar27 = *(long *)((long)GA[lVar1].num_blocks + lVar19 * 2);
                if ((long)iVar12 < lVar27 + -1) {
                  lVar21 = pCVar8[lVar21 + 1] + -1;
                }
                else {
                  lVar21 = *(long *)((long)GA[lVar1].dims + lVar19 * 2);
                }
                *(long *)((long)_hi + lVar19 * 2) = lVar21;
                iVar20 = iVar20 + (int)lVar27;
                lVar19 = lVar19 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar19);
            }
          }
          else if (iVar18 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              if (0 < (short)uVar3) {
                lVar19 = 1;
                uVar17 = 0;
                do {
                  lVar19 = lVar19 * GA[g_a + 1000].nblock[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar31 != uVar17);
                if ((proc < 0) || (lVar19 <= proc)) goto LAB_0017b5b4;
                if (0 < (short)uVar3) {
                  pCVar8 = GA[lVar1].mapc;
                  uVar17 = 0;
                  lVar19 = 0;
                  IVar16 = proc;
                  do {
                    lVar21 = (long)GA[g_a + 1000].nblock[uVar17];
                    lVar27 = IVar16 % lVar21;
                    phi_loc[uVar17 - 0x20] = pCVar8[lVar27 + lVar19];
                    if (lVar27 == lVar21 + -1) {
                      CVar23 = GA[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar23 = pCVar8[lVar27 + lVar19 + 1] + -1;
                    }
                    lVar19 = lVar19 + lVar21;
                    _hi[uVar17] = CVar23;
                    uVar17 = uVar17 + 1;
                    IVar16 = IVar16 / lVar21;
                  } while (uVar31 != uVar17);
                }
              }
            }
            else if (proc < GA[lVar1].num_rstrctd) {
              if (0 < (short)uVar3) {
                lVar19 = 1;
                uVar17 = 0;
                do {
                  lVar19 = lVar19 * GA[g_a + 1000].nblock[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar31 != uVar17);
                if ((proc < 0) || (lVar19 <= proc)) goto LAB_0017b5b4;
                if (0 < (short)uVar3) {
                  pCVar8 = GA[lVar1].mapc;
                  lVar19 = 0;
                  uVar17 = 0;
                  IVar16 = proc;
                  do {
                    lVar21 = (long)GA[g_a + 1000].nblock[uVar17];
                    lVar27 = IVar16 % lVar21;
                    phi_loc[uVar17 - 0x20] = pCVar8[lVar27 + lVar19];
                    if (lVar27 == lVar21 + -1) {
                      CVar23 = GA[g_a + 1000].dims[uVar17];
                    }
                    else {
                      CVar23 = pCVar8[lVar27 + lVar19 + 1] + -1;
                    }
                    lVar19 = lVar19 + lVar21;
                    _hi[uVar17] = CVar23;
                    uVar17 = uVar17 + 1;
                    IVar16 = IVar16 / lVar21;
                  } while (uVar31 != uVar17);
                }
              }
            }
            else {
LAB_0017b5b4:
              if (0 < (short)uVar3) {
                memset(err_string,0,uVar31 * 8);
                memset(_hi,0xff,uVar31 * 8);
              }
            }
          }
          if (uVar31 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
          }
          if ((short)uVar3 < 2) {
            lVar27 = 1;
            lVar19 = 0;
          }
          else {
            lVar27 = 1;
            lVar21 = 0;
            lVar19 = 0;
            do {
              lVar19 = lVar19 + plo_loc[lVar21] * lVar27;
              lVar25 = (_hi[lVar21] - phi_loc[lVar21 + -0x20]) +
                       pgVar11[g_a + 1000].width[lVar21] * 2 + 1;
              ld_loc[lVar21] = lVar25;
              lVar27 = lVar27 * lVar25;
              lVar21 = lVar21 + 1;
            } while (uVar31 - 1 != lVar21);
          }
          lVar21 = *(long *)(stride_loc + uVar31 * 2 + 6);
          ppcVar6 = pgVar11[lVar1].ptr;
          iVar20 = pgVar11[lVar1].elemsize;
          pcVar7 = ppcVar6[proc];
          local_588 = (int)proc_00;
          if (iVar18 - 1U < 3) {
            lVar25 = pgVar11[lVar1].num_blocks[0];
            lVar22 = (long)local_588 % lVar25;
            _index[0] = (int)lVar22;
            if (1 < (short)uVar3) {
              lVar30 = 0;
              uVar17 = proc_00;
              do {
                uVar17 = (long)((int)uVar17 - (int)lVar22) / lVar25;
                lVar25 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                lVar22 = (long)(int)uVar17 % lVar25;
                _index[lVar30 + 1] = (int)lVar22;
                lVar30 = lVar30 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar30);
            }
            if (0 < (short)uVar3) {
              lVar25 = 0;
              do {
                iVar18 = *(int *)((long)_index + lVar25);
                lVar22 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar25 * 2);
                *(long *)(err_string + lVar25 * 2) = lVar22 * iVar18 + 1;
                lVar22 = ((long)iVar18 + 1) * lVar22;
                lVar30 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar25 * 2);
                if (lVar30 <= lVar22) {
                  lVar22 = lVar30;
                }
                *(long *)((long)_hi + lVar25 * 2) = lVar22;
                lVar25 = lVar25 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar25);
            }
          }
          else if (iVar18 == 4) {
            lVar25 = pgVar11[lVar1].num_blocks[0];
            lVar22 = (long)local_588 % lVar25;
            _index[0] = (int)lVar22;
            if (1 < (short)uVar3) {
              lVar30 = 0;
              uVar17 = proc_00;
              do {
                uVar17 = (long)((int)uVar17 - (int)lVar22) / lVar25;
                lVar25 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                lVar22 = (long)(int)uVar17 % lVar25;
                _index[lVar30 + 1] = (int)lVar22;
                lVar30 = lVar30 + 1;
              } while ((uVar31 & 0xffffffff) - 1 != lVar30);
            }
            if (0 < (short)uVar3) {
              pCVar8 = pgVar11[lVar1].mapc;
              lVar25 = 0;
              iVar18 = 0;
              do {
                iVar12 = *(int *)((long)_index + lVar25);
                lVar30 = (long)iVar18 + (long)iVar12;
                *(C_Integer *)(err_string + lVar25 * 2) = pCVar8[lVar30];
                lVar22 = *(long *)((long)pgVar11[lVar1].num_blocks + lVar25 * 2);
                if ((long)iVar12 < lVar22 + -1) {
                  lVar30 = pCVar8[lVar30 + 1] + -1;
                }
                else {
                  lVar30 = *(long *)((long)pgVar11[lVar1].dims + lVar25 * 2);
                }
                *(long *)((long)_hi + lVar25 * 2) = lVar30;
                iVar18 = iVar18 + (int)lVar22;
                lVar25 = lVar25 + 4;
              } while ((uVar31 & 0xffffffff) << 2 != lVar25);
            }
          }
          else if (iVar18 == 0) {
            if (pgVar11[lVar1].num_rstrctd == 0) {
              if (0 < (short)uVar3) {
                lVar25 = 1;
                uVar17 = 0;
                do {
                  lVar25 = lVar25 * pgVar11[g_a + 1000].nblock[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar31 != uVar17);
                if (((long)proc_00 < 0) || (lVar25 <= (long)proc_00)) {
LAB_0017ba4c:
                  uVar17 = uVar31;
                  if (0 < (short)uVar3) goto LAB_0017ba59;
                }
                else if (0 < (short)uVar3) {
                  pCVar8 = pgVar11[lVar1].mapc;
                  lVar25 = 0;
                  uVar29 = 0;
                  uVar17 = proc_00;
                  do {
                    lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar29];
                    lVar22 = (long)uVar17 % lVar30;
                    phi_loc[uVar29 - 0x20] = pCVar8[lVar22 + lVar25];
                    if (lVar22 == lVar30 + -1) {
                      CVar23 = pgVar11[g_a + 1000].dims[uVar29];
                    }
                    else {
                      CVar23 = pCVar8[lVar22 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar30;
                    _hi[uVar29] = CVar23;
                    uVar29 = uVar29 + 1;
                    uVar17 = (long)uVar17 / lVar30;
                  } while (uVar31 != uVar29);
                }
              }
            }
            else if ((long)proc_00 < pgVar11[lVar1].num_rstrctd) {
              if (0 < (short)uVar3) {
                lVar25 = 1;
                uVar17 = 0;
                do {
                  lVar25 = lVar25 * pgVar11[g_a + 1000].nblock[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar31 != uVar17);
                if (((long)proc_00 < 0) || (lVar25 <= (long)proc_00)) goto LAB_0017ba4c;
                if (0 < (short)uVar3) {
                  pCVar8 = pgVar11[lVar1].mapc;
                  lVar25 = 0;
                  uVar29 = 0;
                  uVar17 = proc_00;
                  do {
                    lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar29];
                    lVar22 = (long)uVar17 % lVar30;
                    phi_loc[uVar29 - 0x20] = pCVar8[lVar22 + lVar25];
                    if (lVar22 == lVar30 + -1) {
                      CVar23 = pgVar11[g_a + 1000].dims[uVar29];
                    }
                    else {
                      CVar23 = pCVar8[lVar22 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar30;
                    _hi[uVar29] = CVar23;
                    uVar29 = uVar29 + 1;
                    uVar17 = (long)uVar17 / lVar30;
                  } while (uVar31 != uVar29);
                }
              }
            }
            else if (0 < (short)uVar3) {
              uVar17 = (ulong)uVar3;
LAB_0017ba59:
              memset(err_string,0,uVar17 << 3);
              memset(_hi,0xff,uVar17 << 3);
            }
          }
          if (uVar31 == 1) {
            ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
          }
          if ((short)uVar3 < 2) {
            lVar22 = 1;
            lVar25 = 0;
          }
          else {
            lVar22 = 1;
            lVar25 = 0;
            lVar30 = 0;
            do {
              lVar25 = lVar25 + plo_rem[lVar30] * lVar22;
              lVar26 = (_hi[lVar30] - phi_loc[lVar30 + -0x20]) +
                       pgVar11[g_a + 1000].width[lVar30] * 2 + 1;
              ld_rem[lVar30] = lVar26;
              lVar22 = lVar22 * lVar26;
              lVar30 = lVar30 + 1;
            } while (uVar31 - 1 != lVar30);
          }
          lVar30 = plo_rem[uVar31 - 1];
          pcVar9 = ppcVar6[proc_00];
          stride_loc[0] = iVar4;
          stride_rem[0] = iVar4;
          if (1 < sVar2) {
            lVar26 = 0;
            iVar18 = iVar4;
            iVar12 = iVar4;
            do {
              iVar18 = iVar18 * (int)ld_rem[lVar26];
              stride_rem[lVar26] = iVar18;
              iVar12 = iVar12 * (int)ld_loc[lVar26];
              stride_loc[lVar26] = iVar12;
              stride_rem[lVar26 + 1] = iVar18;
              stride_loc[lVar26 + 1] = iVar12;
              lVar26 = lVar26 + 1;
            } while (lVar24 + -1 != lVar26);
          }
          if (0 < sVar2) {
            lVar26 = 0;
            do {
              count[lVar26] = ((int)phi_loc[lVar26] - (int)plo_loc[lVar26]) + 1;
              lVar26 = lVar26 + 1;
            } while (lVar24 != lVar26);
          }
          count[0] = count[0] * iVar4;
          if (-1 < iVar5) {
            proc_00 = (ulong)(uint)PGRP_LIST[iVar5].inv_map_proc_list[proc_00];
          }
          ARMCI_NbPutS(pcVar7 + (lVar27 * lVar21 + lVar19) * (long)iVar20,stride_loc,
                       pcVar9 + (lVar22 * lVar30 + lVar25) * (long)iVar20,stride_rem,count,
                       (int)(lVar24 + -1),(int)proc_00,(armci_hdl_t *)0x0);
        }
      }
LAB_0017bc3c:
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar28 + (ulong)(lVar28 == 0));
    ARMCI_WaitAll();
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update2_ghosts(Integer g_a)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  /*Integer tlo_loc[MAXDIM], thi_loc[MAXDIM];*/
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return TRUE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update2_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update2_ghosts:malloc failed (_ga_proclist)",0);
  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of PUT operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all PUT operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    /*if (itmp>1) mask0 = TRUE; */
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor to which it is going. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = hi_loc[idx];*/
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        /*tlo_loc[idx] = lo_loc[idx];*/
        /*thi_loc[idx] = lo_loc[idx]+width[idx]-1;*/
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        /*tlo_loc[idx] = hi_loc[idx]-width[idx]+1;*/
        /*thi_loc[idx] = hi_loc[idx];*/
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to send
       data to it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = 2*width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = 0;
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* put data on remote processor */
    /*ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);*/
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_NbPutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem, NULL); 
  }

  ARMCI_WaitAll();
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}